

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void releaseMemArray(Mem *p,int N)

{
  u8 uVar1;
  sqlite3 *db;
  Mem *pMVar2;
  
  if (N != 0 && p != (Mem *)0x0) {
    pMVar2 = p + N;
    db = p->db;
    if (db->pnBytesFreed == (int *)0x0) {
      uVar1 = db->mallocFailed;
      do {
        if ((p->flags & 0x2460) == 0) {
          if (p->szMalloc != 0) {
            sqlite3DbFree(db,p->zMalloc);
            p->szMalloc = 0;
          }
        }
        else {
          vdbeMemClear(p);
        }
        p->flags = 0x80;
        p = p + 1;
      } while (p < pMVar2);
      db->mallocFailed = uVar1;
    }
    else {
      do {
        if (p->szMalloc != 0) {
          sqlite3DbFree(db,p->zMalloc);
        }
        p = p + 1;
      } while (p < pMVar2);
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd = &p[N];
    sqlite3 *db = p->db;
    u8 malloc_failed = db->mallocFailed;
    if( db->pnBytesFreed ){
      do{
        if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
      }while( (++p)<pEnd );
      return;
    }
    do{
      assert( (&p[1])==pEnd || p[0].db==p[1].db );
      assert( sqlite3VdbeCheckMemInvariants(p) );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is 
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to 
      ** callgrind, this causes a certain test case to hit the CPU 4.7 
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if 
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table 
      ** with no indexes using a single prepared INSERT statement, bind() 
      ** and reset(). Inserts are grouped into a transaction.
      */
      testcase( p->flags & MEM_Agg );
      testcase( p->flags & MEM_Dyn );
      testcase( p->flags & MEM_Frame );
      testcase( p->flags & MEM_RowSet );
      if( p->flags&(MEM_Agg|MEM_Dyn|MEM_Frame|MEM_RowSet) ){
        sqlite3VdbeMemRelease(p);
      }else if( p->szMalloc ){
        sqlite3DbFree(db, p->zMalloc);
        p->szMalloc = 0;
      }

      p->flags = MEM_Undefined;
    }while( (++p)<pEnd );
    db->mallocFailed = malloc_failed;
  }
}